

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O2

void leveldb::_Test_ReopenAppendableFile::_RunIt(void)

{
  _Test_ReopenAppendableFile t;
  _Test_ReopenAppendableFile local_8;
  
  local_8.super_EnvTest.env_ = (EnvTest)Env::Default();
  _Run(&local_8);
  return;
}

Assistant:

TEST(EnvTest, ReopenAppendableFile) {
  std::string test_dir;
  ASSERT_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/reopen_appendable_file.txt";
  env_->DeleteFile(test_file_name);

  WritableFile* appendable_file;
  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  std::string data("hello world!");
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  data = "42";
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(ReadFileToString(env_, test_file_name, &data));
  ASSERT_EQ(std::string("hello world!42"), data);
  env_->DeleteFile(test_file_name);
}